

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O3

Reals __thiscall Omega_h::matrices_times_vectors(Omega_h *this,Reals *ms,Reals *vs,Int dim)

{
  int *piVar1;
  Alloc *pAVar2;
  void *pvVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  Alloc *this_00;
  Reals RVar4;
  Reals local_78;
  Reals local_68;
  Reals local_58;
  Reals local_48;
  Reals local_38;
  Reals local_28;
  
  if (dim == 1) {
    local_78.write_.shared_alloc_.alloc = (ms->write_).shared_alloc_.alloc;
    if (((ulong)local_78.write_.shared_alloc_.alloc & 7) == 0 &&
        local_78.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_78.write_.shared_alloc_.alloc =
             (Alloc *)((local_78.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_78.write_.shared_alloc_.alloc)->use_count =
             (local_78.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_78.write_.shared_alloc_.direct_ptr = (ms->write_).shared_alloc_.direct_ptr;
    local_48.write_.shared_alloc_.alloc = (vs->write_).shared_alloc_.alloc;
    if (((ulong)local_48.write_.shared_alloc_.alloc & 7) == 0 &&
        local_48.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_48.write_.shared_alloc_.alloc =
             (Alloc *)((local_48.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_48.write_.shared_alloc_.alloc)->use_count =
             (local_48.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_48.write_.shared_alloc_.direct_ptr = (vs->write_).shared_alloc_.direct_ptr;
    RVar4 = matrices_times_vectors_dim<1>(this,&local_78,&local_48);
    pAVar2 = local_48.write_.shared_alloc_.alloc;
    pvVar3 = RVar4.write_.shared_alloc_.direct_ptr;
    this_00 = local_78.write_.shared_alloc_.alloc;
    if (((ulong)local_48.write_.shared_alloc_.alloc & 7) == 0 &&
        local_48.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_48.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_48.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        pvVar3 = extraout_RDX_00;
        this_00 = local_78.write_.shared_alloc_.alloc;
      }
    }
  }
  else if (dim == 2) {
    local_68.write_.shared_alloc_.alloc = (ms->write_).shared_alloc_.alloc;
    if (((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
        local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_68.write_.shared_alloc_.alloc =
             (Alloc *)((local_68.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_68.write_.shared_alloc_.alloc)->use_count =
             (local_68.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_68.write_.shared_alloc_.direct_ptr = (ms->write_).shared_alloc_.direct_ptr;
    local_38.write_.shared_alloc_.alloc = (vs->write_).shared_alloc_.alloc;
    if (((ulong)local_38.write_.shared_alloc_.alloc & 7) == 0 &&
        local_38.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_38.write_.shared_alloc_.alloc =
             (Alloc *)((local_38.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_38.write_.shared_alloc_.alloc)->use_count =
             (local_38.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_38.write_.shared_alloc_.direct_ptr = (vs->write_).shared_alloc_.direct_ptr;
    RVar4 = matrices_times_vectors_dim<2>(this,&local_68,&local_38);
    pAVar2 = local_38.write_.shared_alloc_.alloc;
    pvVar3 = RVar4.write_.shared_alloc_.direct_ptr;
    this_00 = local_68.write_.shared_alloc_.alloc;
    if (((ulong)local_38.write_.shared_alloc_.alloc & 7) == 0 &&
        local_38.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_38.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_38.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        pvVar3 = extraout_RDX;
        this_00 = local_68.write_.shared_alloc_.alloc;
      }
    }
  }
  else {
    if (dim != 3) {
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_matrix.cpp"
           ,0x42);
    }
    local_58.write_.shared_alloc_.alloc = (ms->write_).shared_alloc_.alloc;
    if (((ulong)local_58.write_.shared_alloc_.alloc & 7) == 0 &&
        local_58.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_58.write_.shared_alloc_.alloc =
             (Alloc *)((local_58.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_58.write_.shared_alloc_.alloc)->use_count =
             (local_58.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_58.write_.shared_alloc_.direct_ptr = (ms->write_).shared_alloc_.direct_ptr;
    local_28.write_.shared_alloc_.alloc = (vs->write_).shared_alloc_.alloc;
    if (((ulong)local_28.write_.shared_alloc_.alloc & 7) == 0 &&
        local_28.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_28.write_.shared_alloc_.alloc =
             (Alloc *)((local_28.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_28.write_.shared_alloc_.alloc)->use_count =
             (local_28.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_28.write_.shared_alloc_.direct_ptr = (vs->write_).shared_alloc_.direct_ptr;
    RVar4 = matrices_times_vectors_dim<3>(this,&local_58,&local_28);
    pAVar2 = local_28.write_.shared_alloc_.alloc;
    pvVar3 = RVar4.write_.shared_alloc_.direct_ptr;
    this_00 = local_58.write_.shared_alloc_.alloc;
    if (((ulong)local_28.write_.shared_alloc_.alloc & 7) == 0 &&
        local_28.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_28.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_28.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        pvVar3 = extraout_RDX_01;
        this_00 = local_58.write_.shared_alloc_.alloc;
      }
    }
  }
  if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
    piVar1 = &this_00->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_00);
      operator_delete(this_00,0x48);
      pvVar3 = extraout_RDX_02;
    }
  }
  RVar4.write_.shared_alloc_.direct_ptr = pvVar3;
  RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar4.write_.shared_alloc_;
}

Assistant:

Reals matrices_times_vectors(Reals ms, Reals vs, Int dim) {
  if (dim == 3) return matrices_times_vectors_dim<3>(ms, vs);
  if (dim == 2) return matrices_times_vectors_dim<2>(ms, vs);
  if (dim == 1) return matrices_times_vectors_dim<1>(ms, vs);
  OMEGA_H_NORETURN(Reals());
}